

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

uchar * __thiscall
Memory::AllocateArray<Memory::HeapAllocator,unsigned_char,true>
          (Memory *this,HeapAllocator *allocator,offset_in_HeapAllocator_to_subr AllocFunc,
          size_t count)

{
  uchar *puVar1;
  size_t count_local;
  offset_in_HeapAllocator_to_subr AllocFunc_local;
  HeapAllocator *allocator_local;
  
  puVar1 = (uchar *)new__<Memory::HeapAllocator>
                              (count,(HeapAllocator *)this,true,
                               (offset_in_HeapAllocator_to_subr)allocator);
  return puVar1;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}